

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O1

void process_ack(NMQ *q,uint32_t sn,uint32_t ts_send)

{
  uint64_t *puVar1;
  uint32_t *puVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  segment *s;
  ulong uVar6;
  int64_t iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar3 = q->snd_una;
  uVar6 = (ulong)(q->MAX_SND_BUF_NUM + sn) % (ulong)q->MAX_SND_BUF_NUM;
  if (((uVar3 <= sn) && (uVar4 = q->snd_nxt, sn < uVar4)) &&
     (q->snd_sn_to_node[uVar6] != (dlnode *)0x0)) {
    if ((ts_send != 0) && (*(uint32_t *)((long)&q->snd_sn_to_node[uVar6][3].prev + 4) == ts_send)) {
      uVar5 = q->current;
      uVar9 = (q->rto_helper).srtt;
      (q->stat).nrtt = (q->stat).nrtt + 1;
      uVar12 = uVar5 - ts_send;
      puVar1 = &(q->stat).nrtt_tot;
      *puVar1 = *puVar1 + (ulong)uVar12;
      uVar12 = uVar12 + (uVar12 == 0);
      if (uVar9 == 0) {
        (q->rto_helper).srtt = uVar12 * 8;
        (q->rto_helper).mdev = uVar12 * 2;
        iVar7 = MAX((ulong)(uVar12 * 2),100);
        (q->rto_helper).mdev_max = (uint32_t)iVar7;
        (q->rto_helper).rttvar = (uint32_t)iVar7;
        (q->rto_helper).rtt_seq = q->snd_nxt;
      }
      else {
        lVar8 = (ulong)uVar12 - (ulong)(uVar9 >> 3);
        (q->rto_helper).srtt = uVar9 + (int)lVar8;
        uVar9 = (q->rto_helper).mdev >> 2;
        if (lVar8 < 0) {
          lVar8 = lVar8 + (ulong)uVar9;
          uVar11 = -lVar8;
          iVar10 = (int)(uVar11 >> 3);
          if (-1 < lVar8) {
            iVar10 = (int)uVar11;
          }
        }
        else {
          iVar10 = (int)lVar8 - uVar9;
        }
        uVar9 = iVar10 + (q->rto_helper).mdev;
        (q->rto_helper).mdev = uVar9;
        if (((q->rto_helper).mdev_max < uVar9) &&
           ((q->rto_helper).mdev_max = uVar9, (q->rto_helper).rttvar < uVar9)) {
          (q->rto_helper).rttvar = uVar9;
        }
        if ((q->rto_helper).rtt_seq < uVar3) {
          uVar3 = (q->rto_helper).rttvar;
          puVar2 = &(q->rto_helper).mdev_max;
          uVar9 = uVar3 - *puVar2;
          if (*puVar2 <= uVar3 && uVar9 != 0) {
            (q->rto_helper).rttvar = uVar3 - (uVar9 >> 2);
          }
          (q->rto_helper).rtt_seq = uVar4;
          (q->rto_helper).mdev_max = 100;
        }
      }
    }
    s = (segment *)q->snd_sn_to_node[uVar6];
    dlist_remove_node((dlnode *)s);
    q->snd_sn_to_node[uVar6] = (dlnode *)0x0;
    recycle_segment(&q->pool,s);
    return;
  }
  return;
}

Assistant:

static void process_ack(NMQ *q, uint32_t sn, uint32_t ts_send) {
    uint32_t sn_mod = modsn(sn, q->MAX_SND_BUF_NUM);
    if (sn < q->snd_una || sn >= q->snd_nxt || !q->snd_sn_to_node[sn_mod]) { // sn 0 is valid!!!
        return;
    }
    if (ts_send) {  //  during processing una. just delete segments and do nothing
        update_rtt(q, sn, ts_send);
    }

    dlnode *node = q->snd_sn_to_node[sn_mod];
    dlist_remove_node(node);

    q->snd_sn_to_node[sn_mod] = NULL;
    segment *s = ADDRESS_FOR(segment, head, node);
    recycle_segment(&q->pool, s);
}